

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> __thiscall
wasm::MultiMemoryLowering::memoryGrow(MultiMemoryLowering *this,Index memIdx,Name memoryName)

{
  BinaryOp BVar1;
  BinaryOp BVar2;
  Function *this_00;
  Builder *pBVar3;
  uintptr_t uVar4;
  Module *pMVar5;
  char *pcVar6;
  _func_int **pp_Var7;
  Index index;
  Index index_00;
  long *plVar8;
  Call *value;
  Block *first;
  Block *pBVar9;
  MemorySize *value_00;
  LocalSet *append;
  Expression *pEVar10;
  MemoryGrow *pMVar11;
  Const *pCVar12;
  Binary *pBVar13;
  If *this_01;
  Binary *pBVar14;
  Expression *pEVar15;
  Binary *this_02;
  MemoryCopy *this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  GlobalSet *this_04;
  undefined1 reuse;
  element_type *peVar17;
  pointer pLVar18;
  undefined4 in_register_00000034;
  ulong uVar19;
  Type TVar20;
  ulong uVar21;
  pointer *__ptr;
  string_view sVar22;
  Name NVar23;
  Signature sig;
  optional<wasm::Type> type_;
  Name name;
  Name name_00;
  Name name_01;
  HeapType local_e0;
  undefined1 local_d8 [8];
  anon_class_8_1_911e227b pageSizeConst;
  anon_class_24_3_04b167d9 getOffsetDelta;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *function;
  anon_union_16_6_1532cd5a_for_Literal_0 local_88;
  element_type local_78;
  Address local_38;
  Builder builder;
  
  local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = (uint)memoryName.super_IString.str._M_len;
  local_38.addr = ((pointer)CONCAT44(in_register_00000034,memIdx))[3].type.id;
  pageSizeConst.builder = (Builder *)&getOffsetDelta.this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pageSizeConst);
  plVar8 = (long *)std::__cxx11::string::append((char *)&pageSizeConst);
  peVar17 = (element_type *)(plVar8 + 2);
  if ((element_type *)*plVar8 == peVar17) {
    local_78.type.id = (peVar17->type).id;
    local_78.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = plVar8[3];
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_78;
  }
  else {
    local_78.type.id = (peVar17->type).id;
    local_88.i64 = (int64_t)(element_type *)*plVar8;
  }
  local_88.func.super_IString.str._M_str = (char *)plVar8[1];
  *plVar8 = (long)peVar17;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  sVar22._M_str = (char *)0x0;
  sVar22._M_len = local_88.func.super_IString.str._M_len;
  local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(in_register_00000034,memIdx);
  sVar22 = IString::interned((IString *)local_88.func.super_IString.str._M_str,sVar22,
                             SUB81(peVar17,0));
  if ((element_type *)local_88.i64 != &local_78) {
    operator_delete(local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_78.type.id + 1);
  }
  if (pageSizeConst.builder != (Builder *)&getOffsetDelta.this) {
    operator_delete(pageSizeConst.builder,
                    (ulong)((long)&((getOffsetDelta.this)->super_Pass)._vptr_Pass + 1));
  }
  pLVar18 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  NVar23 = Names::getValidFunctionName
                     ((Module *)
                      local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[3].type.id,(Name)sVar22);
  TVar20.id = pLVar18[4].type.id;
  sig.results.id = TVar20.id;
  sig.params.id = TVar20.id;
  HeapType::HeapType(&local_e0,sig);
  TVar20.id = (uintptr_t)&local_88;
  local_88.i64 = 0;
  local_88.func.super_IString.str._M_str = (char *)0x0;
  local_78.type.id = 0;
  name.super_IString.str._M_str = NVar23.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)this;
  Builder::makeFunction
            (name,(HeapType)NVar23.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_e0.id,(Expression *)TVar20.id)
  ;
  reuse = (undefined1)local_e0.id;
  if ((void *)local_88.i64 != (void *)0x0) {
    operator_delete(local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_78.type.id - local_88._0_8_);
  }
  this_00 = (Function *)(this->super_Pass)._vptr_Pass;
  sVar22 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe0eb9e),(bool)reuse);
  pLVar18 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  Function::setLocalName(this_00,0,(Name)sVar22);
  local_d8 = (undefined1  [8])&local_38;
  getOffsetDelta.this = (MultiMemoryLowering *)local_d8;
  getOffsetDelta.builder = (Builder *)pLVar18;
  pBVar3 = (Builder *)(this->super_Pass)._vptr_Pass;
  pageSizeConst.builder = (Builder *)local_d8;
  sVar22 = IString::interned((IString *)0xb,(string_view)ZEXT816(0xe0eba9),
                             SUB81(getOffsetDelta.this,0));
  name_00.super_IString.str._M_len = sVar22._M_str;
  name_00.super_IString.str._M_str =
       (char *)local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[4].type.id;
  index = Builder::addVar(pBVar3,(Function *)sVar22._M_len,name_00,TVar20);
  pLVar18 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  uVar21 = (ulong)local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start._4_4_;
  uVar4 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[10].type.id;
  local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString
  .str._M_str = (char *)(uVar21 * 0x10);
  local_88.i64 = 0;
  local_88.func.super_IString.str._M_str = (char *)0x0;
  local_78.type.id = 0;
  TVar20.id = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[4].type.id;
  NVar23.super_IString.str._M_str =
       *(char **)((char *)((long)local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed.
                                 _M_elems[0].field_0.func.super_IString.str._M_str + 8) + uVar4);
  NVar23.super_IString.str._M_len =
       *(size_t *)
        ((long)local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
               super_IString.str._M_str + uVar4);
  value = Builder::makeCall((Builder *)&local_38,NVar23,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            &local_88.func,TVar20,false);
  first = (Block *)Builder::makeLocalSet((Builder *)&local_38,index,(Expression *)value);
  pBVar9 = (Block *)0x0;
  if ((first != (Block *)0x0) &&
     ((((SpecificExpression<(wasm::Expression::Id)9> *)
       &first->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id == BlockId)
     ) {
    pBVar9 = first;
  }
  if (pBVar9 == (Block *)0x0) {
    pBVar9 = Builder::makeBlock((Builder *)&local_38,(Expression *)first);
  }
  local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pBVar9;
  if ((Module *)local_88.i64 != (Module *)0x0) {
    operator_delete(local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_78.type.id - local_88._0_8_);
  }
  if ((long)(pLVar18[7].type.id - (long)pLVar18[7].field_0.func.super_IString.str._M_str) >> 4 ==
      uVar21) {
    index_00 = 0xffffffff;
  }
  else {
    pBVar3 = (Builder *)(this->super_Pass)._vptr_Pass;
    sVar22 = IString::interned((IString *)0xb,(string_view)ZEXT816(0xdd9e4a),SUB81(pBVar9,0));
    name_01.super_IString.str._M_len = sVar22._M_str;
    name_01.super_IString.str._M_str =
         (char *)local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[4].type.id;
    index_00 = Builder::addVar(pBVar3,(Function *)sVar22._M_len,name_01,TVar20);
    value_00 = Builder::makeMemorySize
                         ((Builder *)&local_38,
                          (Name)local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[4].field_0.func.
                                super_IString.str,
                          local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage[5].field_0.i32);
    append = Builder::makeLocalSet((Builder *)&local_38,index_00,(Expression *)value_00);
    local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)Builder::blockify((Builder *)&local_38,
                                    (Expression *)
                                    local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,(Expression *)append)
    ;
    pLVar18 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  uVar4 = pLVar18[4].type.id;
  pEVar10 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x18,8);
  pEVar10->_id = LocalGetId;
  *(undefined4 *)(pEVar10 + 1) = 0;
  (pEVar10->type).id = uVar4;
  pMVar11 = Builder::makeMemoryGrow
                      ((Builder *)&local_38,pEVar10,
                       (Name)local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage[4].field_0.func.
                             super_IString.str,
                       local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[5].field_0.i32);
  pCVar12 = Builder::makeConst<int>((Builder *)&local_38,-1);
  pBVar13 = (Binary *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x28,8);
  (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar13->op = EqInt32;
  pBVar13->left = (Expression *)pMVar11;
  pBVar13->right = (Expression *)pCVar12;
  Binary::finalize(pBVar13);
  local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       (uintptr_t)Builder::makeConst<int>((Builder *)&local_38,-1);
  pEVar10 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x18,8);
  pEVar10->_id = ReturnId;
  (pEVar10->type).id = 0;
  *(undefined8 *)(pEVar10 + 1) = 0;
  (pEVar10->type).id = 1;
  *(uintptr_t *)(pEVar10 + 1) =
       local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
  uVar19 = 0x28;
  this_01 = (If *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_01->ifFalse = (Expression *)0x0;
  this_01->condition = (Expression *)pBVar13;
  this_01->ifTrue = pEVar10;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar19;
  If::finalize(this_01,type_);
  local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       (uintptr_t)
       Builder::blockify((Builder *)&local_38,
                         (Expression *)
                         local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_finish,(Expression *)this_01);
  p_Var16 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[7].field_0.exnData.
            super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((long)(local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[7].type.id - (long)p_Var16) >> 4 != uVar21) {
    if (local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ == 0xffffffff) {
      local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
      super_IString.str._M_str = (char *)0x0;
    }
    else {
      local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&p_Var16->_vptr__Sp_counted_base +
            (long)local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
                  func.super_IString.str._M_str);
      local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
      super_IString.str._M_str =
           (char *)*(undefined8 *)
                    (local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
                     .func.super_IString.str._M_str + 8 + (long)&p_Var16->_vptr__Sp_counted_base);
    }
    uVar19 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[4].type.id;
    if (uVar19 < 7) {
      BVar1 = *(BinaryOp *)(&DAT_00e0f198 + uVar19 * 4);
      pEVar10 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x20,8);
      pEVar10->_id = GlobalGetId;
      (pEVar10->type).id = 0;
      *(undefined8 *)(pEVar10 + 1) = 0;
      *(pointer *)(pEVar10 + 1) =
           local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pEVar10[1].type.id =
           (uintptr_t)
           local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
           super_IString.str._M_str;
      (pEVar10->type).id = uVar19;
      pBVar13 = memoryGrow::anon_class_24_3_04b167d9::operator()
                          ((anon_class_24_3_04b167d9 *)&pageSizeConst);
      pBVar14 = (Binary *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x28,8);
      (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar14->op = BVar1;
      pBVar14->left = pEVar10;
      pBVar14->right = (Expression *)pBVar13;
      Binary::finalize(pBVar14);
      uVar4 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[4].type.id;
      pEVar10 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x20,8);
      pEVar10->_id = GlobalGetId;
      (pEVar10->type).id = 0;
      *(undefined8 *)(pEVar10 + 1) = 0;
      *(pointer *)(pEVar10 + 1) =
           local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pEVar10[1].type.id =
           (uintptr_t)
           local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
           super_IString.str._M_str;
      (pEVar10->type).id = uVar4;
      uVar19 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[4].type.id;
      if (uVar19 < 7) {
        BVar1 = *(BinaryOp *)(&DAT_00e0f144 + uVar19 * 4);
        BVar2 = *(BinaryOp *)(&DAT_00e0f160 + uVar19 * 4);
        pEVar15 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x18,8)
        ;
        pEVar15->_id = LocalGetId;
        *(Index *)(pEVar15 + 1) = index_00;
        (pEVar15->type).id = uVar19;
        local_88.i32 = 0x10000;
        local_78.type.id = 2;
        pCVar12 = Builder::makeConst((Builder *)local_d8,(Literal *)&local_88.func);
        Literal::~Literal((Literal *)&local_88.func);
        pBVar13 = (Binary *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x28,8);
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar13->op = BVar2;
        pBVar13->left = pEVar15;
        pBVar13->right = (Expression *)pCVar12;
        Binary::finalize(pBVar13);
        uVar4 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[4].type.id;
        pEVar15 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x20,8)
        ;
        pEVar15->_id = GlobalGetId;
        (pEVar15->type).id = 0;
        *(undefined8 *)(pEVar15 + 1) = 0;
        *(pointer *)(pEVar15 + 1) =
             local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pEVar15[1].type.id =
             (uintptr_t)
             local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
             super_IString.str._M_str;
        (pEVar15->type).id = uVar4;
        this_02 = (Binary *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x28,8);
        (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        this_02->op = BVar1;
        this_02->left = (Expression *)pBVar13;
        this_02->right = pEVar15;
        Binary::finalize(this_02);
        pMVar5 = (Module *)
                 local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[4].field_0.i64;
        pcVar6 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[4].field_0.func.super_IString.str._M_str;
        local_88.i64 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[4].field_0.i64;
        local_88.func.super_IString.str._M_str =
             local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[4].field_0.func.super_IString.str._M_str;
        this_03 = (MemoryCopy *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x48,8)
        ;
        *(undefined8 *)
         &(this_03->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression = 0;
        (this_03->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id = 0;
        (this_03->destMemory).super_IString.str._M_str = (char *)0x0;
        (this_03->sourceMemory).super_IString.str._M_len = 0;
        this_03->size = (Expression *)0x0;
        (this_03->destMemory).super_IString.str._M_len = 0;
        (this_03->sourceMemory).super_IString.str._M_str = (char *)0x0;
        this_03->dest = (Expression *)0x0;
        this_03->source = (Expression *)0x0;
        (this_03->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression._id =
             MemoryCopyId;
        (this_03->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id = 0;
        (this_03->destMemory).super_IString.str._M_len = 0;
        (this_03->destMemory).super_IString.str._M_str = (char *)0x0;
        (this_03->sourceMemory).super_IString.str._M_len = 0;
        (this_03->sourceMemory).super_IString.str._M_str = (char *)0x0;
        this_03->dest = (Expression *)pBVar14;
        this_03->source = pEVar10;
        this_03->size = (Expression *)this_02;
        (this_03->destMemory).super_IString.str._M_len = (size_t)pMVar5;
        (this_03->destMemory).super_IString.str._M_str = pcVar6;
        (this_03->sourceMemory).super_IString.str._M_len = local_88.i64;
        (this_03->sourceMemory).super_IString.str._M_str = local_88.func.super_IString.str._M_str;
        MemoryCopy::finalize(this_03);
        local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
             (uintptr_t)
             Builder::blockify((Builder *)&local_38,
                               local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
                               [0].type.id,(Expression *)this_03);
        goto LAB_0099ae92;
      }
    }
LAB_0099b041:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
LAB_0099ae92:
  p_Var16 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[7].field_0.gcData.
            super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (uVar21 < (ulong)((long)(local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage[7].type.id -
                             (long)p_Var16) >> 4)) {
    local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ =
         local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start._4_4_ + 1;
    do {
      uVar19 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[4].type.id;
      if (6 < uVar19) goto LAB_0099b041;
      pp_Var7 = p_Var16[uVar21]._vptr__Sp_counted_base;
      local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = *(pointer *)&p_Var16[uVar21]._M_use_count;
      BVar1 = *(BinaryOp *)(&DAT_00e0f198 + uVar19 * 4);
      pEVar10 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x20,8);
      pEVar10->_id = GlobalGetId;
      (pEVar10->type).id = 0;
      *(undefined8 *)(pEVar10 + 1) = 0;
      *(_func_int ***)(pEVar10 + 1) = pp_Var7;
      pEVar10[1].type.id =
           (uintptr_t)
           local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (pEVar10->type).id = uVar19;
      pBVar13 = memoryGrow::anon_class_24_3_04b167d9::operator()
                          ((anon_class_24_3_04b167d9 *)&pageSizeConst);
      pBVar14 = (Binary *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x28,8);
      (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar14->op = BVar1;
      pBVar14->left = pEVar10;
      pBVar14->right = (Expression *)pBVar13;
      Binary::finalize(pBVar14);
      this_04 = (GlobalSet *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x28,8);
      (this_04->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (this_04->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (this_04->name).super_IString.str._M_len = 0;
      (this_04->name).super_IString.str._M_len = (size_t)pp_Var7;
      (this_04->name).super_IString.str._M_str =
           (char *)local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      this_04->value = (Expression *)pBVar14;
      GlobalSet::finalize(this_04);
      local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
           (uintptr_t)
           Builder::blockify((Builder *)&local_38,
                             local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
                             .type.id,(Expression *)this_04);
      uVar21 = (ulong)local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_;
      p_Var16 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[7].field_0.gcData.
                super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ =
           local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_ + 1;
    } while (uVar21 < (ulong)((long)(local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage[7].type.id -
                                    (long)p_Var16) >> 4));
  }
  uVar4 = local_78.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[4].type.id;
  pEVar10 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_38.addr + 0x200),0x18,8);
  pEVar10->_id = LocalGetId;
  *(Index *)(pEVar10 + 1) = index;
  (pEVar10->type).id = uVar4;
  pBVar9 = Builder::blockify((Builder *)&local_38,
                             (Expression *)
                             local_78.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
                             .type.id,pEVar10);
  (this->super_Pass)._vptr_Pass[0xc] = (_func_int *)pBVar9;
  return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Function> memoryGrow(Index memIdx, Name memoryName) {
    Builder builder(*wasm);
    Name name = memoryName.toString() + "_grow";
    Name functionName = Names::getValidFunctionName(*wasm, name);
    auto function = Builder::makeFunction(
      functionName, Signature(pointerType, pointerType), {});
    function->setLocalName(0, "page_delta");
    auto pageSizeConst = [&]() {
      return builder.makeConst(Literal(Memory::kPageSize));
    };
    auto getOffsetDelta = [&]() {
      return builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Mul),
                                builder.makeLocalGet(0, pointerType),
                                pageSizeConst());
    };
    auto getMoveSource = [&](Name global) {
      return builder.makeGlobalGet(global, pointerType);
    };
    Expression* functionBody;
    Index sizeLocal = -1;

    Index returnLocal =
      Builder::addVar(function.get(), "return_size", pointerType);
    functionBody = builder.blockify(builder.makeLocalSet(
      returnLocal, builder.makeCall(memorySizeNames[memIdx], {}, pointerType)));

    if (!isLastMemory(memIdx)) {
      sizeLocal = Builder::addVar(function.get(), "memory_size", pointerType);
      functionBody = builder.blockify(
        functionBody,
        builder.makeLocalSet(
          sizeLocal, builder.makeMemorySize(combinedMemory, memoryInfo)));
    }

    // Attempt to grow the combinedMemory. If -1 returns, enough memory could
    // not be allocated, so return -1.
    functionBody = builder.blockify(
      functionBody,
      builder.makeIf(
        builder.makeBinary(
          EqInt32,
          builder.makeMemoryGrow(
            builder.makeLocalGet(0, pointerType), combinedMemory, memoryInfo),
          builder.makeConst(-1)),
        builder.makeReturn(builder.makeConst(-1))));

    // If we are not growing the last memory, then we need to copy data,
    // shifting it over to accomodate the increase from page_delta
    if (!isLastMemory(memIdx)) {
      // This offset is the starting pt for copying
      auto offsetGlobalName = getOffsetGlobal(memIdx + 1);
      functionBody = builder.blockify(
        functionBody,
        builder.makeMemoryCopy(
          // destination
          builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                             getMoveSource(offsetGlobalName),
                             getOffsetDelta()),
          // source
          getMoveSource(offsetGlobalName),
          // size
          builder.makeBinary(
            Abstract::getBinary(pointerType, Abstract::Sub),
            builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Mul),
                               builder.makeLocalGet(sizeLocal, pointerType),
                               pageSizeConst()),
            getMoveSource(offsetGlobalName)),
          combinedMemory,
          combinedMemory));
    }

    // Adjust the offsets of the globals impacted by the memory.grow call
    for (Index i = memIdx; i < offsetGlobalNames.size(); i++) {
      auto& offsetGlobalName = offsetGlobalNames[i];
      functionBody = builder.blockify(
        functionBody,
        builder.makeGlobalSet(
          offsetGlobalName,
          builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                             getMoveSource(offsetGlobalName),
                             getOffsetDelta())));
    }

    functionBody = builder.blockify(
      functionBody, builder.makeLocalGet(returnLocal, pointerType));

    function->body = functionBody;
    return function;
  }